

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_3U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_short,_3U> *this,uint32_t numChannels,uint32_t targetBits)

{
  ushort uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  ulong uVar3;
  uint uVar4;
  ushort *__dest;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  float outValue;
  allocator_type local_4d;
  float local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  ImageT<unsigned_short,_3U> *local_40;
  ulong local_38;
  
  if (3 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 3]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 3]"
                 );
  }
  uVar6 = targetBits >> 3;
  local_48 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar6 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_4d);
  pvVar2 = local_48;
  if ((this->super_Image).height != 0) {
    local_38 = (ulong)uVar6;
    uVar5 = 0;
    local_40 = this;
    do {
      if ((this->super_Image).width != 0) {
        uVar9 = 0;
        do {
          if (numChannels != 0) {
            uVar8 = 0;
            do {
              uVar4 = (this->super_Image).width * uVar5 + uVar9;
              uVar7 = (uint)uVar8;
              uVar3 = 2;
              if (uVar7 < 2) {
                uVar3 = uVar8;
              }
              uVar1 = this->pixels[uVar4].field_0.comps[uVar3];
              __dest = (ushort *)
                       ((pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start +
                       (uVar4 * numChannels + uVar7) * uVar6);
              if (targetBits == 0x20) {
                local_4c = (float)uVar1;
                memcpy(__dest,&local_4c,local_38);
                pvVar2 = local_48;
                this = local_40;
              }
              else if (targetBits == 0x10) {
                *__dest = uVar1;
              }
              uVar8 = (ulong)(uVar7 + 1);
            } while (numChannels != uVar7 + 1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (this->super_Image).width);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Image).height);
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }